

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateVertex(ON_SubD_FixedSizeHeap *this,ON_SubDEdge *edge0)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *v1;
  uint edge_capacity;
  double subdP [3];
  ON_SubDEdge *edge0_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  subdP[2] = (double)edge0;
  if (edge0 == (ON_SubDEdge *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else {
    bVar1 = ON_SubDEdge::GetSubdivisionPoint(edge0,(double *)&stack0xffffffffffffffc8);
    if (bVar1) {
      this_local = (ON_SubD_FixedSizeHeap *)
                   AllocateVertex(this,(double *)&stack0xffffffffffffffc8,4);
      if ((ON_SubDVertex *)this_local == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
      else {
        uVar2 = ON_SubDComponentBase::SubdivisionLevel((ON_SubDComponentBase *)subdP[2]);
        ON_SubDComponentBase::SetSubdivisionLevel((ON_SubDComponentBase *)this_local,uVar2 + 1);
        if ((*(char *)((long)subdP[2] + 0x60) == '\x01') ||
           (*(char *)((long)subdP[2] + 0x60) == '\x04')) {
          ((ON_SubDVertex *)this_local)->m_vertex_tag = Smooth;
        }
        else if (*(char *)((long)subdP[2] + 0x60) == '\x02') {
          ((ON_SubDVertex *)this_local)->m_vertex_tag = Crease;
        }
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubD_FixedSizeHeap *)0x0;
    }
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

ON_SubDVertex* ON_SubD_FixedSizeHeap::AllocateVertex(
  const ON_SubDEdge* edge0
  )
{
  if ( nullptr == edge0)
    return ON_SUBD_RETURN_ERROR(nullptr);

  double subdP[3];
  if (false == edge0->GetSubdivisionPoint(subdP))
    return ON_SUBD_RETURN_ERROR(nullptr);

  const unsigned int edge_capacity = 4;
  ON_SubDVertex* v1 = AllocateVertex(subdP, edge_capacity);
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1->SetSubdivisionLevel( edge0->SubdivisionLevel() + 1 );

  if (ON_SubDEdgeTag::Smooth == edge0->m_edge_tag || ON_SubDEdgeTag::SmoothX == edge0->m_edge_tag)
    v1->m_vertex_tag = ON_SubDVertexTag::Smooth;
  else if (ON_SubDEdgeTag::Crease == edge0->m_edge_tag)
    v1->m_vertex_tag = ON_SubDVertexTag::Crease;

  return v1;
}